

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

monst * makedog(void)

{
  int iVar1;
  int iVar2;
  obj *otmp_00;
  char *pcStack_28;
  int pettype;
  char *petname;
  obj *otmp;
  monst *mtmp;
  
  if (preferred_pet == 'n') {
    mtmp = (monst *)0x0;
  }
  else {
    iVar1 = pet_type();
    if (iVar1 == 0x12) {
      pcStack_28 = dogname;
    }
    else if (iVar1 == 0x6b) {
      pcStack_28 = horsename;
    }
    else if (iVar1 == 0xef) {
      pcStack_28 = monkeyname;
    }
    else if ((iVar1 == 0x16) || (iVar1 == 0x19)) {
      pcStack_28 = wolfname;
    }
    else if (iVar1 == 0x152) {
      pcStack_28 = crocname;
    }
    else if (iVar1 == 0x5a) {
      pcStack_28 = ratname;
    }
    else {
      pcStack_28 = catname;
    }
    if (*pcStack_28 == '\0') {
      if (iVar1 == 0x12) {
        if (urole.malenum == 0x15b) {
          pcStack_28 = "Slasher";
        }
        if (urole.malenum == 0x165) {
          pcStack_28 = "Hachi";
        }
        if (urole.malenum == 0x15a) {
          pcStack_28 = "Idefix";
        }
        if (urole.malenum == 0x163) {
          pcStack_28 = "Sirius";
        }
      }
      else if ((iVar1 == 0x5a) && (urole.malenum == 0x15d)) {
        pcStack_28 = "Nicodemus";
      }
    }
    otmp = (obj *)makemon(mons + iVar1,level,(int)u.ux,(int)u.uy,4);
    if ((((iVar1 == 0x16) || (iVar1 == 0x19)) || (iVar1 == 0xef)) || (iVar1 == 0x152)) {
      ((monst *)otmp)->m_lev = '\x01';
      iVar2 = dice(1,8);
      ((monst *)otmp)->mhp = iVar2;
      ((monst *)otmp)->mhpmax = iVar2;
    }
    if ((iVar1 == 0x6b) && (otmp_00 = mksobj(level,0xf0,'\x01','\0'), otmp_00 != (obj *)0x0)) {
      iVar2 = mpickobj((monst *)otmp,otmp_00);
      if (iVar2 != 0) {
        panic("merged saddle?");
      }
      ((monst *)otmp)->misc_worn_check = ((monst *)otmp)->misc_worn_check | 0x100000;
      *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xffffff7f | 0x80;
      *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xffffffbf | 0x40;
      *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xffffffdf | 0x20;
      otmp_00->owornmask = 0x100000;
      otmp_00->corpsenm = ((monst *)otmp)->m_id;
      update_mon_intrinsics(level,(monst *)otmp,otmp_00,'\x01','\x01');
    }
    if (((*pcStack_28 == '\0') && (iVar1 == 0x22)) && (iVar1 = rn2(100), iVar1 == 0)) {
      if ((*(uint *)&((monst *)otmp)->field_0x60 & 1) == 0) {
        pcStack_28 = "Kali";
      }
      else {
        pcStack_28 = "Shiva";
      }
    }
    if (*pcStack_28 != '\0') {
      otmp = (obj *)christen_monst((monst *)otmp,pcStack_28);
    }
    initedog((monst *)otmp);
    mtmp = (monst *)otmp;
  }
  return mtmp;
}

Assistant:

struct monst *makedog(void)
{
	struct monst *mtmp;
	struct obj *otmp;
	const char *petname;
	int   pettype;

	if (preferred_pet == 'n') return NULL;

	pettype = pet_type();
	if (pettype == PM_LITTLE_DOG)
		petname = dogname;
	else if (pettype == PM_PONY)
		petname = horsename;
	else if (pettype == PM_MONKEY)
		petname = monkeyname;
	else if (pettype == PM_WOLF || pettype == PM_WINTER_WOLF_CUB)
		petname = wolfname;
	else if (pettype == PM_BABY_CROCODILE)
		petname = crocname;
	else if (pettype == PM_SEWER_RAT)
		petname = ratname;
	else
		petname = catname;

	/* default pet names */
	if (!*petname) {
	    if (pettype == PM_LITTLE_DOG) {
		/* All of these names were for dogs. */
		if (Role_if(PM_CAVEMAN)) petname = "Slasher";   /* The Warrior */
		if (Role_if(PM_SAMURAI)) petname = "Hachi";     /* Shibuya Station */
		if (Role_if(PM_BARBARIAN)) petname = "Idefix";  /* Obelix */
		if (Role_if(PM_RANGER)) petname = "Sirius";     /* Orion's dog */
	    } else if (pettype == PM_SEWER_RAT) {
		if (Role_if(PM_CONVICT)) petname = "Nicodemus"; /* Rats of NIMH */
	    }
	}

	mtmp = makemon(&mons[pettype], level, u.ux, u.uy, MM_EDOG);

	/* Keep the exotic pets from being higher-level than normal starting
	 * pets.  (makedog is only called once, during game setup, so this
	 * is the place to put it.) */
	if (pettype == PM_WOLF ||
	    pettype == PM_WINTER_WOLF_CUB ||
	    pettype == PM_MONKEY ||
	    pettype == PM_BABY_CROCODILE) {
	    mtmp->m_lev  = 1;
	    mtmp->mhpmax = mtmp->mhp = dice(1,8);
	}

	/* Horses already wear a saddle */
	if (pettype == PM_PONY && !!(otmp = mksobj(level, SADDLE, TRUE, FALSE))) {
	    if (mpickobj(mtmp, otmp))
		panic("merged saddle?");
	    mtmp->misc_worn_check |= W_SADDLE;
	    otmp->dknown = otmp->bknown = otmp->rknown = 1;
	    otmp->owornmask = W_SADDLE;
	    otmp->leashmon = mtmp->m_id;
	    update_mon_intrinsics(level, mtmp, otmp, TRUE, TRUE);
	}

	if (!*petname && pettype == PM_KITTEN && !rn2(100)) {
	    if (mtmp->female) petname = "Shiva"; /* PM: RIP 1 Oct 1998 -  6 Sep 2009 */
	    else petname = "Kali";		 /* PM: RIP 1 May 2000 - 22 Oct 2012 */
	}

	if (*petname)
		mtmp = christen_monst(mtmp, petname);

	initedog(mtmp);
	return mtmp;
}